

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O2

int fixupReg(InternalInstruction *insn,OperandSpecifier *op)

{
  byte bVar1;
  uint uVar2;
  EABase EVar3;
  uint8_t uVar4;
  uint8_t local_19;
  
  bVar1 = op->encoding;
  if (6 < bVar1 - 2) {
    if (bVar1 == 1) {
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->reg - (char)insn->regBase,&local_19);
      insn->reg = (uint)bVar1;
    }
    else {
      if (bVar1 != 9) {
        return -1;
      }
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->vvvv,&local_19);
      insn->vvvv = (uint)bVar1;
    }
    if (local_19 != '\0') {
      return 0;
    }
    return -1;
  }
  EVar3 = insn->eaBase;
  uVar2 = EVar3 - insn->eaRegBase;
  if (EVar3 < insn->eaRegBase) {
    return 0;
  }
  switch(op->type) {
  case '9':
    uVar4 = '\x02';
    goto LAB_0019f3b9;
  case ':':
    uVar4 = '\x04';
    goto LAB_0019f3b9;
  case ';':
    uVar4 = '\b';
LAB_0019f3b9:
    insn->operandSize = uVar4;
    EVar3 = (uVar2 & 7) + EA_REG_MM0;
    break;
  case '<':
    uVar4 = '\x02';
    goto LAB_0019f3ac;
  case '=':
    uVar4 = '\x04';
    goto LAB_0019f3ac;
  case '>':
    uVar4 = '\b';
    goto LAB_0019f3ac;
  case '?':
    uVar4 = '\x10';
LAB_0019f3ac:
    insn->operandSize = uVar4;
    EVar3 = uVar2 + EA_REG_XMM0;
    break;
  case '@':
    insn->operandSize = ' ';
    EVar3 = uVar2 + EA_REG_YMM0;
    break;
  case 'A':
    insn->operandSize = '@';
    EVar3 = uVar2 + EA_REG_ZMM0;
    break;
  case 'B':
  case 'E':
  case 'F':
    EVar3 = uVar2 + EA_REG_K0;
    break;
  case 'C':
  case 'D':
  case 'G':
  case 'H':
  case 'I':
  case 'M':
switchD_0019f2a3_caseD_43:
    insn->eaBase = EA_BASE_NONE;
    return -1;
  case 'J':
    EVar3 = (uVar2 & 7) + EA_REG_ES;
    break;
  case 'K':
    insn->eaBase = uVar2 + EA_REG_DR0 & EA_REG_CR12;
    if ((byte)uVar2 < 8) {
      return 0;
    }
    return -1;
  case 'L':
    insn->operandSize = '\x04';
    EVar3 = uVar2 + EA_REG_CR0;
    break;
  case 'N':
    break;
  default:
    switch(op->type) {
    case '\b':
      insn->operandSize = '\x01';
      if ((((byte)uVar2 & 0xfc) == 4) && (insn->rexPrefix != '\0')) {
        EVar3 = uVar2 + EA_REG_R12B;
      }
      else {
        EVar3 = uVar2 + EA_REG_AL;
      }
      break;
    case '\t':
      insn->operandSize = '\x02';
      EVar3 = uVar2 + EA_REG_AX;
      break;
    case '\n':
      insn->operandSize = '\x04';
      EVar3 = uVar2 + EA_REG_EAX;
      break;
    case '\v':
      insn->operandSize = '\b';
      EVar3 = uVar2 + EA_REG_RAX;
      break;
    default:
      goto switchD_0019f2a3_caseD_43;
    }
  }
  insn->eaBase = EVar3 & EA_REG_CR12;
  return 0;
}

Assistant:

static int fixupReg(struct InternalInstruction *insn,
		const struct OperandSpecifier *op)
{
	uint8_t valid;

	// dbgprintf(insn, "fixupReg()");

	switch ((OperandEncoding)op->encoding) {
		default:
			//debug("Expected a REG or R/M encoding in fixupReg");
			return -1;
		case ENCODING_VVVV:
			insn->vvvv = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					insn->vvvv,
					&valid);
			if (!valid)
				return -1;
			break;
		case ENCODING_REG:
			insn->reg = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					(uint8_t)(insn->reg - insn->regBase),
					&valid);
			if (!valid)
				return -1;
			break;
		CASE_ENCODING_RM:
			if (insn->eaBase >= insn->eaRegBase) {
				insn->eaBase = (EABase)fixupRMValue(insn,
						(OperandType)op->type,
						(uint8_t)(insn->eaBase - insn->eaRegBase),
						&valid);
				if (!valid)
					return -1;
			}
			break;
	}

	return 0;
}